

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_autolink_uri(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end)

{
  bool bVar1;
  MD_OFFSET off;
  MD_OFFSET *p_end_local;
  MD_OFFSET max_end_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  
  if ((beg + 1 < max_end) && ((byte)ctx->text[beg + 1] < 0x80)) {
    for (off = beg + 2; off < max_end; off = off + 1) {
      if (0x20 < off - beg) {
        return 0;
      }
      if ((ctx->text[off] == ':') && (2 < off - beg)) {
        while( true ) {
          bVar1 = false;
          if (off < max_end) {
            bVar1 = ctx->text[off] != '>';
          }
          if (!bVar1) break;
          if ((((ctx->text[off] == ' ') || (ctx->text[off] == '\t')) || (ctx->text[off] == '\v')) ||
             (((ctx->text[off] == '\f' || ((byte)ctx->text[off] < 0x20)) ||
              ((ctx->text[off] == '\x7f' || (ctx->text[off] == '<')))))) {
            return 0;
          }
          off = off + 1;
        }
        if (off < max_end) {
          *p_end = off + 1;
          return 1;
        }
        return 0;
      }
      if ((((byte)ctx->text[off] < 0x41) || (0x5a < (byte)ctx->text[off])) &&
         ((((byte)ctx->text[off] < 0x61 || (0x7a < (byte)ctx->text[off])) &&
          (((((byte)ctx->text[off] < 0x30 || (0x39 < (byte)ctx->text[off])) &&
            (ctx->text[off] != '+')) && ((ctx->text[off] != '-' && (ctx->text[off] != '.')))))))) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
md_is_autolink_uri(MD_CTX* ctx, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg+1;

    MD_ASSERT(CH(beg) == _T('<'));

    /* Check for scheme. */
    if(off >= max_end  ||  !ISASCII(off))
        return FALSE;
    off++;
    while(1) {
        if(off >= max_end)
            return FALSE;
        if(off - beg > 32)
            return FALSE;
        if(CH(off) == _T(':')  &&  off - beg >= 3)
            break;
        if(!ISALNUM(off) && CH(off) != _T('+') && CH(off) != _T('-') && CH(off) != _T('.'))
            return FALSE;
        off++;
    }

    /* Check the path after the scheme. */
    while(off < max_end  &&  CH(off) != _T('>')) {
        if(ISWHITESPACE(off) || ISCNTRL(off) || CH(off) == _T('<'))
            return FALSE;
        off++;
    }

    if(off >= max_end)
        return FALSE;

    MD_ASSERT(CH(off) == _T('>'));
    *p_end = off+1;
    return TRUE;
}